

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_constant_wnaf(secp256k1_scalar *number,int w)

{
  uint v_00;
  uint v_01;
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  int v;
  secp256k1_scalar t;
  secp256k1_scalar scalar_skew;
  secp256k1_scalar num;
  int bits;
  int skew;
  int i;
  int wnaf [256];
  secp256k1_scalar shift;
  secp256k1_scalar x;
  secp256k1_scalar *in_stack_fffffffffffffb38;
  secp256k1_scalar *in_stack_fffffffffffffb40;
  secp256k1_scalar *in_stack_fffffffffffffb50;
  secp256k1_scalar *in_stack_fffffffffffffb58;
  secp256k1_scalar *in_stack_fffffffffffffb60;
  secp256k1_scalar *in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  secp256k1_scalar *scalar;
  int *wnaf_00;
  int local_45c;
  uint local_458 [258];
  secp256k1_scalar local_50;
  secp256k1_scalar local_30;
  int local_c;
  undefined8 *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_458,0,0x400);
  scalar = (secp256k1_scalar *)*local_8;
  wnaf_00 = (int *)local_8[1];
  secp256k1_scalar_set_int(&local_30,0);
  secp256k1_scalar_set_int(&local_50,1 << ((byte)local_c & 0x1f));
  for (local_45c = 0; local_45c < 0x10; local_45c = local_45c + 1) {
    secp256k1_scalar_shr_int((secp256k1_scalar *)&stack0xfffffffffffffb78,8);
  }
  v_01 = secp256k1_wnaf_const(wnaf_00,scalar,in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
  local_45c = (local_c + 0x7f) / local_c;
  while( true ) {
    if (local_45c < 0) {
      secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xfffffffffffffb58,v_01);
      secp256k1_scalar_add
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      iVar1 = secp256k1_scalar_eq(&local_30,(secp256k1_scalar *)&stack0xfffffffffffffb78);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1560,"test condition failed: secp256k1_scalar_eq(&x, &num)");
        abort();
      }
      return;
    }
    v_00 = local_458[local_45c];
    if (v_00 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x154f,"test condition failed: v != 0");
      abort();
    }
    if ((v_00 & 1) == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1550,"test condition failed: v & 1");
      abort();
    }
    if ((int)v_00 <= -(1 << ((byte)local_c & 0x1f))) break;
    if (1 << ((byte)local_c & 0x1f) <= (int)v_00) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1552,"test condition failed: v < (1 << w)");
      abort();
    }
    secp256k1_scalar_mul
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    if ((int)v_00 < 0) {
      secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xfffffffffffffb38,-v_00);
      secp256k1_scalar_negate(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    }
    else {
      secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xfffffffffffffb38,v_00);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    local_45c = local_45c + -1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x1551,"test condition failed: v > -(1 << w)");
  abort();
}

Assistant:

static void test_constant_wnaf(const secp256k1_scalar *number, int w) {
    secp256k1_scalar x, shift;
    int wnaf[256] = {0};
    int i;
    int skew;
    int bits = 256;
    secp256k1_scalar num = *number;
    secp256k1_scalar scalar_skew;

    secp256k1_scalar_set_int(&x, 0);
    secp256k1_scalar_set_int(&shift, 1 << w);
    for (i = 0; i < 16; ++i) {
        secp256k1_scalar_shr_int(&num, 8);
    }
    bits = 128;
    skew = secp256k1_wnaf_const(wnaf, &num, w, bits);

    for (i = WNAF_SIZE_BITS(bits, w); i >= 0; --i) {
        secp256k1_scalar t;
        int v = wnaf[i];
        CHECK(v != 0); /* check nonzero */
        CHECK(v & 1);  /* check parity */
        CHECK(v > -(1 << w)); /* check range above */
        CHECK(v < (1 << w));  /* check range below */

        secp256k1_scalar_mul(&x, &x, &shift);
        if (v >= 0) {
            secp256k1_scalar_set_int(&t, v);
        } else {
            secp256k1_scalar_set_int(&t, -v);
            secp256k1_scalar_negate(&t, &t);
        }
        secp256k1_scalar_add(&x, &x, &t);
    }
    /* Skew num because when encoding numbers as odd we use an offset */
    secp256k1_scalar_set_int(&scalar_skew, skew);
    secp256k1_scalar_add(&num, &num, &scalar_skew);
    CHECK(secp256k1_scalar_eq(&x, &num));
}